

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O1

void TPZFMatrix<long>::PrintStatic
               (long *ptr,int64_t rows,int64_t cols,char *name,ostream *out,MatrixOutputFormat form)

{
  size_t sVar1;
  ostream *poVar2;
  int64_t iVar3;
  long *plVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  char number [32];
  long local_78;
  char local_58 [40];
  
  if (form == EMathematicaInput) {
    if (name == (char *)0x0) {
      std::ios::clear((int)out + (int)*(undefined8 *)(*(long *)out + -0x18));
    }
    else {
      sVar1 = strlen(name);
      std::__ostream_insert<char,std::char_traits<char>>(out,name,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"\n{ ",3);
    if (0 < rows) {
      lVar6 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(out,"\n{ ",3);
        if (0 < cols) {
          uVar8 = 1;
          lVar7 = 0;
          plVar4 = ptr;
          do {
            sprintf(local_58,"%16.16lf",ABS((double)*plVar4));
            sVar1 = strlen(local_58);
            std::__ostream_insert<char,std::char_traits<char>>(out,local_58,sVar1);
            if (lVar7 < cols + -1) {
              std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
            }
            if ((uVar8 / 6) * 6 + -1 == lVar7) {
              std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
              std::ostream::put((char)out);
              std::ostream::flush();
            }
            lVar7 = lVar7 + 1;
            uVar8 = uVar8 + 1;
            plVar4 = plVar4 + rows;
          } while (cols != lVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out," }",2);
        if (lVar6 < rows + -1) {
          std::__ostream_insert<char,std::char_traits<char>>(out,",",1);
        }
        lVar6 = lVar6 + 1;
        ptr = ptr + 1;
      } while (lVar6 != rows);
    }
    pcVar5 = " }\n";
    lVar6 = 3;
  }
  else {
    if (form != EInputFormat) {
      if (form != EFormatted) {
        return;
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,"Writing matrix \'",0x10);
      if (name != (char *)0x0) {
        sVar1 = strlen(name);
        std::__ostream_insert<char,std::char_traits<char>>(out,name,sVar1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,"\' (",3);
      poVar2 = std::ostream::_M_insert<long>((long)out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," x ",3);
      poVar2 = std::ostream::_M_insert<long>((long)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"):\n",3);
      if (0 < rows) {
        lVar6 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(out,"\t",1);
          iVar3 = cols;
          if (0 < cols) {
            do {
              poVar2 = std::ostream::_M_insert<long>((long)out);
              std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  ",2);
              iVar3 = iVar3 + -1;
            } while (iVar3 != 0);
          }
          std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
          lVar6 = lVar6 + 1;
        } while (lVar6 != rows);
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
      return;
    }
    poVar2 = std::ostream::_M_insert<long>((long)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if (0 < rows) {
      local_78 = 0;
      do {
        if (0 < cols) {
          lVar6 = 0;
          plVar4 = ptr;
          do {
            if (*plVar4 != 0) {
              poVar2 = std::ostream::_M_insert<long>((long)out);
              local_58[0] = ' ';
              poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_58,1);
              poVar2 = std::ostream::_M_insert<long>((long)poVar2);
              local_58[0] = ' ';
              poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_58,1);
              poVar2 = std::ostream::_M_insert<long>((long)poVar2);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
              std::ostream::put((char)poVar2);
              std::ostream::flush();
            }
            lVar6 = lVar6 + 1;
            plVar4 = plVar4 + rows;
          } while (cols != lVar6);
        }
        local_78 = local_78 + 1;
        ptr = ptr + 1;
      } while (local_78 != rows);
    }
    pcVar5 = "-1 -1 0.\n";
    lVar6 = 9;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar5,lVar6);
  return;
}

Assistant:

void TPZFMatrix<TVar>::PrintStatic(const TVar *ptr, int64_t rows, int64_t cols, const char *name, std::ostream& out,const MatrixOutputFormat form){
    
    if(form == EFormatted) {
        out << "Writing matrix '";
        if(name) out << name;
        out << "' (" << rows << " x " << cols << "):\n";
        
        for ( int64_t row = 0; row < rows; row++) {
            out << "\t";
            for ( int64_t col = 0; col < cols; col++ ) {
                out << SELECTEL(ptr,rows, row, col) << "  ";
            }
            out << "\n";
        }
        out << "\n";
    } else if (form == EInputFormat) {
        out << rows << " " << cols << endl;
        for ( int64_t row = 0; row < rows; row++) {
            for ( int64_t col = 0; col < cols; col++ ) {
                TVar val = SELECTEL(ptr,rows,row, col);
                if(val != (TVar)0.) out << row << ' ' << col << ' ' << val << std::endl;
            }
        }
        out << "-1 -1 0.\n";
    } else if( form == EMathematicaInput)
    {
        char number[32];
        out << name << "\n{ ";
        for ( int64_t row = 0; row < rows; row++) {
            out << "\n{ ";
            for ( int64_t col = 0; col < cols; col++ ) {
                TVar val = SELECTEL(ptr,rows,row, col);
                sprintf(number, "%16.16lf", (double)fabs(val));
                out << number;
                if(col < cols-1)
                    out << ", ";
                if((col+1) % 6 == 0)out << std::endl;
            }
            out << " }";
            if(row < rows-1)
                out << ",";
        }
        
        out << " }\n";
        
    }
    
}